

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveLeft2sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2)

{
  int iVar1;
  long in_RDI;
  int *in_R9;
  int *in_stack_00000048;
  
  if (*(int *)(in_RDI + 0xa0) == 0) {
    iVar1 = solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    *in_R9 = iVar1;
    iVar1 = solveUleft((CLUFactor<double> *)rn2,(double)ridx2,rhs2,idx2,vec2,in_stack_00000048,
                       this._4_4_);
    *in_R9 = iVar1;
    iVar1 = solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    *idx = iVar1;
    iVar1 = solveUleft((CLUFactor<double> *)rn2,(double)ridx2,rhs2,idx2,vec2,in_stack_00000048,
                       this._4_4_);
    *idx = iVar1;
  }
  else {
    iVar1 = solveUleft((CLUFactor<double> *)rn2,(double)ridx2,rhs2,idx2,vec2,in_stack_00000048,
                       this._4_4_);
    *in_R9 = iVar1;
    iVar1 = solveLleftForest(this,eps,vec,idx,rhs._4_4_);
    *in_R9 = iVar1;
    iVar1 = solveUleft((CLUFactor<double> *)rn2,(double)ridx2,rhs2,idx2,vec2,in_stack_00000048,
                       this._4_4_);
    *idx = iVar1;
    iVar1 = solveLleftForest(this,eps,vec,idx,rhs._4_4_);
    *idx = iVar1;
  }
  iVar1 = solveLleft((CLUFactor<double> *)vec2,(double)in_stack_00000048,(double *)this,(int *)eps,
                     vec._4_4_);
  *in_R9 = iVar1;
  iVar1 = solveLleft((CLUFactor<double> *)vec2,(double)in_stack_00000048,(double *)this,(int *)eps,
                     vec._4_4_);
  *idx = iVar1;
  return;
}

Assistant:

void CLUFactor<R>::vSolveLeft2sparse(R eps,
                                     R* vec, int* idx,                      /* result */
                                     R* rhs, int* ridx, int& rn,            /* rhs    */
                                     R* vec2, int* idx2,                    /* result2 */
                                     R* rhs2, int* ridx2, int& rn2)         /* rhs2    */
{
   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      rn2 = solveUleft(eps, vec2, idx2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      rn2 = solveUleft(eps, vec2, idx2, rhs2, ridx2, rn2);
      rn2 = solveLleftForest(eps, vec2, idx2, rn2);

   }

   rn = solveLleft(eps, vec, idx, rn);
   rn2 = solveLleft(eps, vec2, idx2, rn2);
}